

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool SetCachedTextureCoordinatesFromMaterial
               (ON_Mesh *mesh,
               function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_mapping_func,
               ON_Material *material,ON_MappingRef *mapping_ref,
               ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache,bool perform_cleanup)

{
  bool bVar1;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_e8;
  ON_Mesh *local_c8;
  undefined1 local_c0 [8];
  ON_SimpleArray<const_ON_Mesh_*> meshes;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_98;
  undefined1 local_78 [8];
  unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
  per_vertex_channels;
  bool perform_cleanup_local;
  ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache_local;
  ON_MappingRef *mapping_ref_local;
  ON_Material *material_local;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_mapping_func_local;
  ON_Mesh *mesh_local;
  
  per_vertex_channels._M_h._M_single_bucket._7_1_ = perform_cleanup;
  std::
  unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
  ::unordered_map((unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
                   *)local_78);
  std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function(&local_98,get_mapping_func)
  ;
  bVar1 = ON_Mesh_Private_AddPerVertexMappingChannels
                    (&local_98,mapping_ref,mappings_to_cache,material,
                     (unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
                      *)local_78);
  std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::~function(&local_98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ON_SimpleArray<const_ON_Mesh_*>::ON_SimpleArray((ON_SimpleArray<const_ON_Mesh_*> *)local_c0);
    local_c8 = mesh;
    ON_SimpleArray<const_ON_Mesh_*>::Append((ON_SimpleArray<const_ON_Mesh_*> *)local_c0,&local_c8);
    std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
              (&local_e8,get_mapping_func);
    CacheWcsProjections(mesh,&local_e8,material,mapping_ref);
    std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::~function(&local_e8);
    mesh_local._7_1_ =
         ON_Mesh_Private_SetCachedTextureCoordinatesFromMaterial
                   ((ON_SimpleArray<const_ON_Mesh_*> *)local_c0,
                    (unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
                     *)local_78,mapping_ref,
                    (bool)(per_vertex_channels._M_h._M_single_bucket._7_1_ & 1),
                    (shared_ptr<CRhVboData> *)0x0);
    meshes.m_count = 1;
    ON_SimpleArray<const_ON_Mesh_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Mesh_*> *)local_c0);
  }
  else {
    mesh_local._7_1_ = false;
    meshes.m_count = 1;
  }
  std::
  unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
                    *)local_78);
  return mesh_local._7_1_;
}

Assistant:

bool SetCachedTextureCoordinatesFromMaterial(const ON_Mesh& mesh, std::function<ON_TextureMapping(const ON_MappingChannel*)> get_mapping_func, const ON_Material& material, const ON_MappingRef* mapping_ref, const ON_SimpleArray<ON_TextureMapping::TYPE>& mappings_to_cache, bool perform_cleanup)
{
  // Create a map of all texture mappings that require per-vertex texture coordinates
  std::unordered_map<unsigned int, ON_TextureMapping> per_vertex_channels;
  if (!ON_Mesh_Private_AddPerVertexMappingChannels(get_mapping_func, mapping_ref, mappings_to_cache, material, per_vertex_channels))
    return false;

  ON_SimpleArray<const ON_Mesh*> meshes;
  meshes.Append(&mesh);

  CacheWcsProjections(mesh, get_mapping_func, material, mapping_ref);

  return ON_Mesh_Private_SetCachedTextureCoordinatesFromMaterial(meshes, per_vertex_channels, mapping_ref, perform_cleanup, nullptr);
}